

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialAnalyzerSettings.cpp
# Opt level: O3

void __thiscall SerialAnalyzerSettings::SerialAnalyzerSettings(SerialAnalyzerSettings *this)

{
  Channel *this_00;
  unique_ptr<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
  *puVar1;
  AnalyzerSettingInterfaceChannel *pAVar2;
  AnalyzerSettingInterfaceInteger *pAVar3;
  AnalyzerSettingInterfaceBool *pAVar4;
  AnalyzerSettingInterfaceNumberList *pAVar5;
  AnalyzerSettingInterfaceChannel *this_01;
  AnalyzerSettingInterfaceInteger *this_02;
  AnalyzerSettingInterfaceBool *this_03;
  AnalyzerSettingInterfaceNumberList *pAVar6;
  ostream *poVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  Channel *pCVar12;
  char *pcVar13;
  undefined *puVar14;
  uint uVar15;
  pointer *__ptr;
  stringstream ss;
  char *local_1d8;
  char local_1c8 [16];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__SerialAnalyzerSettings_0010bd68;
  this_00 = &this->mInputChannel;
  uVar11 = 0xffffffffffffffff;
  Channel::Channel(this_00,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this->mBitRate = 0x2580;
  this->mBitsPerTransfer = 8;
  this->mShiftOrder = LsbFirst;
  this->mStopBits = 1.0;
  this->mParity = None;
  this->mInverted = false;
  this->mUseAutobaud = false;
  this->mSerialMode = Normal;
  puVar1 = &this->mInputChannelInterface;
  (this->mInputChannelInterface)._M_t.
  super___uniq_ptr_impl<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceChannel_*,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceChannel_*,_false>._M_head_impl =
       (AnalyzerSettingInterfaceChannel *)0x0;
  (this->mBitRateInterface)._M_t.
  super___uniq_ptr_impl<AnalyzerSettingInterfaceInteger,_std::default_delete<AnalyzerSettingInterfaceInteger>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceInteger_*,_std::default_delete<AnalyzerSettingInterfaceInteger>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceInteger_*,_false>._M_head_impl =
       (AnalyzerSettingInterfaceInteger *)0x0;
  (this->mBitsPerTransferInterface)._M_t.
  super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl =
       (AnalyzerSettingInterfaceNumberList *)0x0;
  (this->mShiftOrderInterface)._M_t.
  super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl =
       (AnalyzerSettingInterfaceNumberList *)0x0;
  (this->mStopBitsInterface)._M_t.
  super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl =
       (AnalyzerSettingInterfaceNumberList *)0x0;
  (this->mParityInterface)._M_t.
  super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl =
       (AnalyzerSettingInterfaceNumberList *)0x0;
  (this->mInvertedInterface)._M_t.
  super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl =
       (AnalyzerSettingInterfaceNumberList *)0x0;
  (this->mUseAutobaudInterface)._M_t.
  super___uniq_ptr_impl<AnalyzerSettingInterfaceBool,_std::default_delete<AnalyzerSettingInterfaceBool>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceBool_*,_std::default_delete<AnalyzerSettingInterfaceBool>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceBool_*,_false>._M_head_impl =
       (AnalyzerSettingInterfaceBool *)0x0;
  (this->mSerialModeInterface)._M_t.
  super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl =
       (AnalyzerSettingInterfaceNumberList *)0x0;
  this_01 = (AnalyzerSettingInterfaceChannel *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar11);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(this_01);
  pAVar2 = (puVar1->_M_t).
           super___uniq_ptr_impl<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
           ._M_t.
           super__Tuple_impl<0UL,_AnalyzerSettingInterfaceChannel_*,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
           .super__Head_base<0UL,_AnalyzerSettingInterfaceChannel_*,_false>._M_head_impl;
  (puVar1->_M_t).
  super___uniq_ptr_impl<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceChannel_*,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceChannel_*,_false>._M_head_impl = this_01;
  if (pAVar2 != (AnalyzerSettingInterfaceChannel *)0x0) {
    (**(code **)(*(long *)pAVar2 + 8))();
    this_01 = (puVar1->_M_t).
              super___uniq_ptr_impl<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
              ._M_t.
              super__Tuple_impl<0UL,_AnalyzerSettingInterfaceChannel_*,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
              .super__Head_base<0UL,_AnalyzerSettingInterfaceChannel_*,_false>._M_head_impl;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_01,"Input Channel");
  pCVar12 = this_00;
  AnalyzerSettingInterfaceChannel::SetChannel
            ((Channel *)
             (puVar1->_M_t).
             super___uniq_ptr_impl<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
             ._M_t.
             super__Tuple_impl<0UL,_AnalyzerSettingInterfaceChannel_*,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
             .super__Head_base<0UL,_AnalyzerSettingInterfaceChannel_*,_false>._M_head_impl);
  this_02 = (AnalyzerSettingInterfaceInteger *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar12);
  AnalyzerSettingInterfaceInteger::AnalyzerSettingInterfaceInteger(this_02);
  pAVar3 = (this->mBitRateInterface)._M_t.
           super___uniq_ptr_impl<AnalyzerSettingInterfaceInteger,_std::default_delete<AnalyzerSettingInterfaceInteger>_>
           ._M_t.
           super__Tuple_impl<0UL,_AnalyzerSettingInterfaceInteger_*,_std::default_delete<AnalyzerSettingInterfaceInteger>_>
           .super__Head_base<0UL,_AnalyzerSettingInterfaceInteger_*,_false>._M_head_impl;
  (this->mBitRateInterface)._M_t.
  super___uniq_ptr_impl<AnalyzerSettingInterfaceInteger,_std::default_delete<AnalyzerSettingInterfaceInteger>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceInteger_*,_std::default_delete<AnalyzerSettingInterfaceInteger>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceInteger_*,_false>._M_head_impl = this_02;
  if (pAVar3 != (AnalyzerSettingInterfaceInteger *)0x0) {
    (**(code **)(*(long *)pAVar3 + 8))();
    this_02 = (this->mBitRateInterface)._M_t.
              super___uniq_ptr_impl<AnalyzerSettingInterfaceInteger,_std::default_delete<AnalyzerSettingInterfaceInteger>_>
              ._M_t.
              super__Tuple_impl<0UL,_AnalyzerSettingInterfaceInteger_*,_std::default_delete<AnalyzerSettingInterfaceInteger>_>
              .super__Head_base<0UL,_AnalyzerSettingInterfaceInteger_*,_false>._M_head_impl;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_02,"Bit Rate (Bits/s)");
  AnalyzerSettingInterfaceInteger::SetMax
            ((int)(this->mBitRateInterface)._M_t.
                  super___uniq_ptr_impl<AnalyzerSettingInterfaceInteger,_std::default_delete<AnalyzerSettingInterfaceInteger>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceInteger_*,_std::default_delete<AnalyzerSettingInterfaceInteger>_>
                  .super__Head_base<0UL,_AnalyzerSettingInterfaceInteger_*,_false>._M_head_impl);
  AnalyzerSettingInterfaceInteger::SetMin
            ((int)(this->mBitRateInterface)._M_t.
                  super___uniq_ptr_impl<AnalyzerSettingInterfaceInteger,_std::default_delete<AnalyzerSettingInterfaceInteger>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceInteger_*,_std::default_delete<AnalyzerSettingInterfaceInteger>_>
                  .super__Head_base<0UL,_AnalyzerSettingInterfaceInteger_*,_false>._M_head_impl);
  uVar11 = (ulong)this->mBitRate;
  AnalyzerSettingInterfaceInteger::SetInteger
            ((int)(this->mBitRateInterface)._M_t.
                  super___uniq_ptr_impl<AnalyzerSettingInterfaceInteger,_std::default_delete<AnalyzerSettingInterfaceInteger>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceInteger_*,_std::default_delete<AnalyzerSettingInterfaceInteger>_>
                  .super__Head_base<0UL,_AnalyzerSettingInterfaceInteger_*,_false>._M_head_impl);
  this_03 = (AnalyzerSettingInterfaceBool *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar11);
  AnalyzerSettingInterfaceBool::AnalyzerSettingInterfaceBool(this_03);
  pAVar4 = (this->mUseAutobaudInterface)._M_t.
           super___uniq_ptr_impl<AnalyzerSettingInterfaceBool,_std::default_delete<AnalyzerSettingInterfaceBool>_>
           ._M_t.
           super__Tuple_impl<0UL,_AnalyzerSettingInterfaceBool_*,_std::default_delete<AnalyzerSettingInterfaceBool>_>
           .super__Head_base<0UL,_AnalyzerSettingInterfaceBool_*,_false>._M_head_impl;
  (this->mUseAutobaudInterface)._M_t.
  super___uniq_ptr_impl<AnalyzerSettingInterfaceBool,_std::default_delete<AnalyzerSettingInterfaceBool>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceBool_*,_std::default_delete<AnalyzerSettingInterfaceBool>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceBool_*,_false>._M_head_impl = this_03;
  if (pAVar4 != (AnalyzerSettingInterfaceBool *)0x0) {
    (**(code **)(*(long *)pAVar4 + 8))();
    this_03 = (this->mUseAutobaudInterface)._M_t.
              super___uniq_ptr_impl<AnalyzerSettingInterfaceBool,_std::default_delete<AnalyzerSettingInterfaceBool>_>
              ._M_t.
              super__Tuple_impl<0UL,_AnalyzerSettingInterfaceBool_*,_std::default_delete<AnalyzerSettingInterfaceBool>_>
              .super__Head_base<0UL,_AnalyzerSettingInterfaceBool_*,_false>._M_head_impl;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_03,"");
  AnalyzerSettingInterfaceBool::SetCheckBoxText
            ((char *)(this->mUseAutobaudInterface)._M_t.
                     super___uniq_ptr_impl<AnalyzerSettingInterfaceBool,_std::default_delete<AnalyzerSettingInterfaceBool>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_AnalyzerSettingInterfaceBool_*,_std::default_delete<AnalyzerSettingInterfaceBool>_>
                     .super__Head_base<0UL,_AnalyzerSettingInterfaceBool_*,_false>._M_head_impl);
  uVar11 = (ulong)this->mUseAutobaud;
  AnalyzerSettingInterfaceBool::SetValue
            (SUB81((this->mUseAutobaudInterface)._M_t.
                   super___uniq_ptr_impl<AnalyzerSettingInterfaceBool,_std::default_delete<AnalyzerSettingInterfaceBool>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_AnalyzerSettingInterfaceBool_*,_std::default_delete<AnalyzerSettingInterfaceBool>_>
                   .super__Head_base<0UL,_AnalyzerSettingInterfaceBool_*,_false>._M_head_impl,0));
  pAVar6 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar11);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar6);
  pAVar5 = (this->mBitsPerTransferInterface)._M_t.
           super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           ._M_t.
           super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl;
  (this->mBitsPerTransferInterface)._M_t.
  super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl = pAVar6;
  if (pAVar5 != (AnalyzerSettingInterfaceNumberList *)0x0) {
    (**(code **)(*(long *)pAVar5 + 8))();
    pAVar6 = (this->mBitsPerTransferInterface)._M_t.
             super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
             ._M_t.
             super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
             .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar6,"Bits per Frame");
  lVar10 = 1;
  do {
    std::__cxx11::stringstream::stringstream(local_1b8);
    iVar9 = (int)lVar10;
    if (iVar9 == 8) {
      lVar8 = 0x1e;
      poVar7 = local_1a8;
      pcVar13 = "8 Bits per Transfer (Standard)";
    }
    else if (iVar9 == 1) {
      lVar8 = 0x12;
      poVar7 = local_1a8;
      pcVar13 = "1 Bit per Transfer";
    }
    else {
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      lVar8 = 0x12;
      pcVar13 = " Bits per Transfer";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar13,lVar8);
    pAVar5 = (this->mBitsPerTransferInterface)._M_t.
             super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
             ._M_t.
             super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
             .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl;
    std::__cxx11::stringbuf::str();
    AnalyzerSettingInterfaceNumberList::AddNumber((double)iVar9,(char *)pAVar5,local_1d8);
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8);
    }
    puVar14 = &std::__cxx11::stringstream::VTT;
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x41);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mBitsPerTransfer);
  pAVar6 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)puVar14);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar6);
  pAVar5 = (this->mStopBitsInterface)._M_t.
           super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           ._M_t.
           super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl;
  (this->mStopBitsInterface)._M_t.
  super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl = pAVar6;
  if (pAVar5 != (AnalyzerSettingInterfaceNumberList *)0x0) {
    (**(code **)(*(long *)pAVar5 + 8))();
    pAVar6 = (this->mStopBitsInterface)._M_t.
             super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
             ._M_t.
             super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
             .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar6,"Stop Bits");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)(this->mStopBitsInterface)._M_t.
                         super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>.
                         _M_head_impl,"1 Stop Bit (Standard)");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.5,(char *)(this->mStopBitsInterface)._M_t.
                         super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>.
                         _M_head_impl,"1.5 Stop Bits");
  pcVar13 = "2 Stop Bits";
  AnalyzerSettingInterfaceNumberList::AddNumber
            (2.0,(char *)(this->mStopBitsInterface)._M_t.
                         super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>.
                         _M_head_impl,"2 Stop Bits");
  AnalyzerSettingInterfaceNumberList::SetNumber(this->mStopBits);
  pAVar6 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar13);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar6);
  pAVar5 = (this->mParityInterface)._M_t.
           super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           ._M_t.
           super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl;
  (this->mParityInterface)._M_t.
  super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl = pAVar6;
  if (pAVar5 != (AnalyzerSettingInterfaceNumberList *)0x0) {
    (**(code **)(*(long *)pAVar5 + 8))();
    pAVar6 = (this->mParityInterface)._M_t.
             super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
             ._M_t.
             super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
             .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar6,"Parity Bit");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)(this->mParityInterface)._M_t.
                         super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>.
                         _M_head_impl,"No Parity Bit (Standard)");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)(this->mParityInterface)._M_t.
                         super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>.
                         _M_head_impl,"Even Parity Bit");
  pcVar13 = "Odd Parity Bit";
  AnalyzerSettingInterfaceNumberList::AddNumber
            (2.0,(char *)(this->mParityInterface)._M_t.
                         super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>.
                         _M_head_impl,"Odd Parity Bit");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mParity);
  pAVar6 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar13);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar6);
  pAVar5 = (this->mShiftOrderInterface)._M_t.
           super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           ._M_t.
           super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl;
  (this->mShiftOrderInterface)._M_t.
  super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl = pAVar6;
  if (pAVar5 != (AnalyzerSettingInterfaceNumberList *)0x0) {
    (**(code **)(*(long *)pAVar5 + 8))();
    pAVar6 = (this->mShiftOrderInterface)._M_t.
             super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
             ._M_t.
             super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
             .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar6,"Significant Bit");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)(this->mShiftOrderInterface)._M_t.
                         super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>.
                         _M_head_impl,"Least Significant Bit Sent First (Standard)");
  pcVar13 = "Most Significant Bit Sent First";
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)(this->mShiftOrderInterface)._M_t.
                         super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>.
                         _M_head_impl,"Most Significant Bit Sent First");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mShiftOrder);
  pAVar6 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar13);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar6);
  pAVar5 = (this->mInvertedInterface)._M_t.
           super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           ._M_t.
           super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl;
  (this->mInvertedInterface)._M_t.
  super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl = pAVar6;
  if (pAVar5 != (AnalyzerSettingInterfaceNumberList *)0x0) {
    (**(code **)(*(long *)pAVar5 + 8))();
    pAVar6 = (this->mInvertedInterface)._M_t.
             super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
             ._M_t.
             super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
             .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar6,"Signal inversion");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)(this->mInvertedInterface)._M_t.
                         super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>.
                         _M_head_impl,"Non Inverted (Standard)");
  pcVar13 = "Inverted";
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)(this->mInvertedInterface)._M_t.
                         super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>.
                         _M_head_impl,"Inverted");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)(int)this->mInverted);
  pAVar6 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar13);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar6);
  pAVar5 = (this->mSerialModeInterface)._M_t.
           super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           ._M_t.
           super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl;
  (this->mSerialModeInterface)._M_t.
  super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl = pAVar6;
  if (pAVar5 != (AnalyzerSettingInterfaceNumberList *)0x0) {
    (**(code **)(*(long *)pAVar5 + 8))();
    pAVar6 = (this->mSerialModeInterface)._M_t.
             super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
             ._M_t.
             super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
             .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar6,"Mode");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)(this->mSerialModeInterface)._M_t.
                         super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>.
                         _M_head_impl,"Normal");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)(this->mSerialModeInterface)._M_t.
                         super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>.
                         _M_head_impl,"MP - Address indicated by MSB=0");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (2.0,(char *)(this->mSerialModeInterface)._M_t.
                         super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>.
                         _M_head_impl,"MDB - Address indicated by MSB=1 (TX only)");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mSerialMode);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar15 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar15,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar15,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar15,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)this_00,true);
  return;
}

Assistant:

SerialAnalyzerSettings::SerialAnalyzerSettings()
    : mInputChannel( UNDEFINED_CHANNEL ),
      mBitRate( 9600 ),
      mBitsPerTransfer( 8 ),
      mStopBits( 1.0 ),
      mParity( AnalyzerEnums::None ),
      mShiftOrder( AnalyzerEnums::LsbFirst ),
      mInverted( false ),
      mUseAutobaud( false ),
      mSerialMode( SerialAnalyzerEnums::Normal )
{
    mInputChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mInputChannelInterface->SetTitleAndTooltip( "Input Channel", "Standard Async Serial" );
    mInputChannelInterface->SetChannel( mInputChannel );

    mBitRateInterface.reset( new AnalyzerSettingInterfaceInteger() );
    mBitRateInterface->SetTitleAndTooltip( "Bit Rate (Bits/s)", "Specify the bit rate in bits per second." );
    mBitRateInterface->SetMax( 100000000 );
    mBitRateInterface->SetMin( 1 );
    mBitRateInterface->SetInteger( static_cast<int>( mBitRate ) );

    mUseAutobaudInterface.reset( new AnalyzerSettingInterfaceBool() );
    mUseAutobaudInterface->SetTitleAndTooltip(
        "", "With Autobaud turned on, the analyzer will run as usual, with the current bit rate.  At the same time, it will also keep "
            "track of the shortest pulse it detects. \nAfter analyzing all the data, if the bit rate implied by this shortest pulse is "
            "different by more than 10% from the specified bit rate, the bit rate will be changed and the analysis run again." );
    mUseAutobaudInterface->SetCheckBoxText( "Use Autobaud" );
    mUseAutobaudInterface->SetValue( mUseAutobaud );

    mBitsPerTransferInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mBitsPerTransferInterface->SetTitleAndTooltip( "Bits per Frame", "Select the number of bits per frame" );
    for( U32 i = 1; i <= 64; i++ )
    {
        std::stringstream ss;

        if( i == 1 )
            ss << "1 Bit per Transfer";
        else if( i == 8 )
            ss << "8 Bits per Transfer (Standard)";
        else
            ss << i << " Bits per Transfer";

        mBitsPerTransferInterface->AddNumber( i, ss.str().c_str(), "" );
    }
    mBitsPerTransferInterface->SetNumber( mBitsPerTransfer );


    mStopBitsInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mStopBitsInterface->SetTitleAndTooltip( "Stop Bits", "Specify the number of stop bits." );
    mStopBitsInterface->AddNumber( 1.0, "1 Stop Bit (Standard)", "" );
    mStopBitsInterface->AddNumber( 1.5, "1.5 Stop Bits", "" );
    mStopBitsInterface->AddNumber( 2.0, "2 Stop Bits", "" );
    mStopBitsInterface->SetNumber( mStopBits );


    mParityInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mParityInterface->SetTitleAndTooltip( "Parity Bit", "Specify None, Even, or Odd Parity." );
    mParityInterface->AddNumber( AnalyzerEnums::None, "No Parity Bit (Standard)", "" );
    mParityInterface->AddNumber( AnalyzerEnums::Even, "Even Parity Bit", "" );
    mParityInterface->AddNumber( AnalyzerEnums::Odd, "Odd Parity Bit", "" );
    mParityInterface->SetNumber( mParity );


    mShiftOrderInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mShiftOrderInterface->SetTitleAndTooltip( "Significant Bit",
                                              "Select if the most significant bit or least significant bit is transmitted first" );
    mShiftOrderInterface->AddNumber( AnalyzerEnums::LsbFirst, "Least Significant Bit Sent First (Standard)", "" );
    mShiftOrderInterface->AddNumber( AnalyzerEnums::MsbFirst, "Most Significant Bit Sent First", "" );
    mShiftOrderInterface->SetNumber( mShiftOrder );


    mInvertedInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mInvertedInterface->SetTitleAndTooltip( "Signal inversion", "Specify if the serial signal is inverted" );
    mInvertedInterface->AddNumber( false, "Non Inverted (Standard)", "" );
    mInvertedInterface->AddNumber( true, "Inverted", "" );

    mInvertedInterface->SetNumber( mInverted );
    enum Mode
    {
        Normal,
        MpModeRightZeroMeansAddress,
        MpModeRightOneMeansAddress,
        MpModeLeftZeroMeansAddress,
        MpModeLeftOneMeansAddress
    };

    mSerialModeInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mSerialModeInterface->SetTitleAndTooltip( "Mode", "" );
    mSerialModeInterface->AddNumber( SerialAnalyzerEnums::Normal, "Normal", "" );
    mSerialModeInterface->AddNumber( SerialAnalyzerEnums::MpModeMsbZeroMeansAddress, "MP - Address indicated by MSB=0",
                                     "Multi-processor, 9-bit serial" );
    mSerialModeInterface->AddNumber( SerialAnalyzerEnums::MpModeMsbOneMeansAddress, "MDB - Address indicated by MSB=1 (TX only)",
                                     "Multi-drop, 9-bit serial" );
    mSerialModeInterface->SetNumber( mSerialMode );

    AddInterface( mInputChannelInterface.get() );
    AddInterface( mBitRateInterface.get() );
    AddInterface( mBitsPerTransferInterface.get() );
    AddInterface( mStopBitsInterface.get() );
    AddInterface( mParityInterface.get() );
    AddInterface( mShiftOrderInterface.get() );
    AddInterface( mInvertedInterface.get() );
    AddInterface( mSerialModeInterface.get() );

    // AddExportOption( 0, "Export as text/csv file", "text (*.txt);;csv (*.csv)" );
    AddExportOption( 0, "Export as text/csv file" );
    AddExportExtension( 0, "text", "txt" );
    AddExportExtension( 0, "csv", "csv" );

    ClearChannels();
    AddChannel( mInputChannel, "Serial", false );
}